

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

bool genVulkanFunctionsPC
               (QList<VkSpecParser::Command> *commands,
               QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
               QString *outputBase)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Command *pCVar4;
  qsizetype qVar5;
  char *pcVar6;
  char *pcVar7;
  QString *this;
  char *pcVar8;
  long in_FS_OFFSET;
  int *idx;
  QString *dst;
  Command *c;
  QList<VkSpecParser::Command> *__range2;
  QStringList *coreFunctionsInVersion;
  QString *version;
  QStringList *__range1;
  int vulkan10InstCount;
  int vulkan10DevCount;
  char16_t *str_6;
  char16_t *str_5;
  char16_t *str_1;
  char16_t *str_3;
  char16_t *str_2;
  char16_t *str_4;
  QString str;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator __end1;
  const_iterator __begin1;
  QString instCmdNamesStr;
  QString devCmdNamesStr;
  int instIdx;
  int devIdx;
  QString instCmdWrapperStr;
  QString devCmdWrapperStr;
  QFile f;
  QStringBuilder<const_QString_&,_QString> *in_stack_fffffffffffffac8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  QString *in_stack_fffffffffffffae8;
  Preamble *in_stack_fffffffffffffaf0;
  QStringBuilder<QStringBuilder<const_char_(&)[6],_const_QString_&>,_const_char_(&)[2]>
  *in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  uint *className;
  Command *c_00;
  uint local_480;
  uint local_47c;
  bool local_449;
  char local_328 [24];
  QArrayDataPointer<char16_t> local_310 [2];
  QArrayDataPointer<char16_t> local_2e0 [2];
  QArrayDataPointer<char16_t> local_2b0 [2];
  QArrayDataPointer<char16_t> local_280 [3];
  QChar local_232;
  QArrayDataPointer<char16_t> local_230 [4];
  Command *local_1d0;
  const_iterator local_1c8;
  const_iterator local_1c0;
  QStringBuilder<const_char_(&)[6],_const_QString_&> local_1b8;
  QStringBuilder<const_char_(&)[6],_const_QString_&> local_190;
  QString *local_150;
  const_iterator local_148;
  const_iterator local_140;
  QString local_138;
  QString local_120;
  uint local_108;
  uint local_104;
  undefined1 local_100 [32];
  char16_t *local_e0;
  qsizetype local_d8;
  QString local_d0 [2];
  char local_a0 [32];
  QArrayDataPointer<char16_t> local_80 [3];
  undefined1 local_30 [24];
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_80,(Data *)0x0,L"_p.cpp",6);
  QString::QString((QString *)in_stack_fffffffffffffad0,(DataPointer *)in_stack_fffffffffffffac8);
  operator+((QString *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
            (QString *)in_stack_fffffffffffffad0);
  QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffac8);
  QFile::QFile((QFile *)&local_18,(QString *)local_30);
  QString::~QString((QString *)0x106b9a);
  QStringBuilder<const_QString_&,_QString>::~QStringBuilder
            ((QStringBuilder<const_QString_&,_QString> *)0x106ba7);
  QString::~QString((QString *)0x106bb4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
  operator|((enum_type)((ulong)in_stack_fffffffffffffad0 >> 0x20),
            (enum_type)in_stack_fffffffffffffad0);
  uVar2 = QFile::open((QFlags *)&local_18);
  if ((uVar2 & 1) == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (char *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),(char *)in_stack_fffffffffffffac8);
    QFile::fileName();
    QtPrivate::asString(local_d0);
    QString::toLocal8Bit(in_stack_fffffffffffffae8);
    pcVar3 = QByteArray::constData((QByteArray *)0x106c48);
    QMessageLogger::warning(local_a0,"Failed to write %s",pcVar3);
    QByteArray::~QByteArray((QByteArray *)0x106c6e);
    QString::~QString((QString *)0x106c7b);
    local_449 = false;
  }
  else {
    local_100._24_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    local_e0 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_d8 = -0x5555555555555556;
    QString::QString((QString *)0x106ccd);
    local_100._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    local_100._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_100._16_8_ = -0x5555555555555556;
    QString::QString((QString *)0x106d07);
    local_104 = 0;
    local_108 = 0;
    local_120.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_120.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_120.d.size = -0x5555555555555556;
    QString::QString((QString *)0x106d57);
    local_138.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_138.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_138.d.size = -0x5555555555555556;
    QString::QString((QString *)0x106d91);
    local_47c = 0;
    local_480 = 0;
    local_140.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_140 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffad0);
    local_148.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_148 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffad0);
    while( true ) {
      local_150 = local_148.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_140,local_148);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_140);
      QMap<QString,_QList<QString>_>::operator[]
                ((QMap<QString,_QList<QString>_> *)in_stack_fffffffffffffaf0,
                 in_stack_fffffffffffffae8);
      local_190 = operator+((char (*) [6])in_stack_fffffffffffffad0,
                            (QString *)in_stack_fffffffffffffac8);
      operator+((QStringBuilder<const_char_(&)[6],_const_QString_&> *)in_stack_fffffffffffffad0,
                (char (*) [2])in_stack_fffffffffffffac8);
      operator+=((QString *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffaf8);
      local_1b8 = operator+((char (*) [6])in_stack_fffffffffffffad0,
                            (QString *)in_stack_fffffffffffffac8);
      operator+((QStringBuilder<const_char_(&)[6],_const_QString_&> *)in_stack_fffffffffffffad0,
                (char (*) [2])in_stack_fffffffffffffac8);
      operator+=((QString *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                 in_stack_fffffffffffffaf8);
      local_1c0.i = (Command *)0xaaaaaaaaaaaaaaaa;
      local_1c0 = QList<VkSpecParser::Command>::begin
                            ((QList<VkSpecParser::Command> *)in_stack_fffffffffffffad0);
      local_1c8.i = (Command *)0xaaaaaaaaaaaaaaaa;
      local_1c8 = QList<VkSpecParser::Command>::end
                            ((QList<VkSpecParser::Command> *)in_stack_fffffffffffffad0);
      while( true ) {
        local_1d0 = local_1c8.i;
        bVar1 = QList<VkSpecParser::Command>::const_iterator::operator!=(&local_1c0,local_1c8);
        if (!bVar1) break;
        pCVar4 = QList<VkSpecParser::Command>::const_iterator::operator*(&local_1c0);
        bVar1 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)
                           CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                           (QString *)in_stack_fffffffffffffad0,
                           (CaseSensitivity)((ulong)in_stack_fffffffffffffac8 >> 0x20));
        if (bVar1) {
          if ((pCVar4->deviceLevel & 1U) == 0) {
            c_00 = (Command *)local_100;
          }
          else {
            c_00 = (Command *)(local_100 + 0x18);
          }
          if ((pCVar4->deviceLevel & 1U) == 0) {
            className = &local_108;
          }
          else {
            className = &local_104;
          }
          funcSig(c_00,(char *)className);
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x1070e5);
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    (local_230,(Data *)0x0,L"\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ",0x29);
          QString::QString((QString *)in_stack_fffffffffffffad0,
                           (DataPointer *)in_stack_fffffffffffffac8);
          QChar::QChar<char16_t,_true>(&local_232,L' ');
          QString::arg<int,_true>
                    ((QString *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                     (int)((ulong)in_stack_fffffffffffffad0 >> 0x20),(int)in_stack_fffffffffffffad0,
                     (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffffae8 >> 0x30));
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x1071b3);
          QString::~QString((QString *)0x1071c0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
          funcCall((Command *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00),
                   (int)((ulong)in_stack_fffffffffffffaf8 >> 0x20));
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x10720e);
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_280,(Data *)0x0,L";\n}\n\n",5);
          QString::QString((QString *)in_stack_fffffffffffffad0,
                           (DataPointer *)in_stack_fffffffffffffac8);
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x107292);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
          *className = *className + 1;
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_2b0,(Data *)0x0,L"        \"",9);
          QString::QString((QString *)in_stack_fffffffffffffad0,
                           (DataPointer *)in_stack_fffffffffffffac8);
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x10736b);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_2e0,(Data *)0x0,L"\",\n",3);
          QString::QString((QString *)in_stack_fffffffffffffad0,
                           (DataPointer *)in_stack_fffffffffffffac8);
          QString::operator+=((QString *)in_stack_fffffffffffffad0,
                              (QString *)in_stack_fffffffffffffac8);
          QString::~QString((QString *)0x107411);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
        }
        QList<VkSpecParser::Command>::const_iterator::operator++(&local_1c0);
      }
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_310,(Data *)0x0,L"VK_VERSION_1_0",0xe);
      QString::QString((QString *)in_stack_fffffffffffffad0,(DataPointer *)in_stack_fffffffffffffac8
                      );
      bVar1 = operator==((QString *)in_stack_fffffffffffffad0,(QString *)in_stack_fffffffffffffac8);
      QString::~QString((QString *)0x1074c2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffad0);
      if (bVar1) {
        local_480 = local_108;
        local_47c = local_104;
      }
      QString::operator+=((QString *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffae8);
      QString::operator+=((QString *)in_stack_fffffffffffffad0,(char *)in_stack_fffffffffffffae8);
      QList<QString>::~QList((QList<QString> *)0x10752a);
      QList<QString>::const_iterator::operator++(&local_140);
    }
    qVar5 = QString::size(&local_120);
    if (2 < qVar5) {
      QString::chop((longlong)&local_120);
    }
    qVar5 = QString::size(&local_138);
    if (2 < qVar5) {
      QString::chop((longlong)&local_138);
    }
    local_328[0] = -0x56;
    local_328[1] = -0x56;
    local_328[2] = -0x56;
    local_328[3] = -0x56;
    local_328[4] = -0x56;
    local_328[5] = -0x56;
    local_328[6] = -0x56;
    local_328[7] = -0x56;
    local_328[8] = -0x56;
    local_328[9] = -0x56;
    local_328[10] = -0x56;
    local_328[0xb] = -0x56;
    local_328[0xc] = -0x56;
    local_328[0xd] = -0x56;
    local_328[0xe] = -0x56;
    local_328[0xf] = -0x56;
    local_328[0x10] = -0x56;
    local_328[0x11] = -0x56;
    local_328[0x12] = -0x56;
    local_328[0x13] = -0x56;
    local_328[0x14] = -0x56;
    local_328[0x15] = -0x56;
    local_328[0x16] = -0x56;
    local_328[0x17] = -0x56;
    Preamble::get(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    pcVar3 = QByteArray::constData((QByteArray *)0x1075dc);
    QString::toUtf8((QString *)in_stack_fffffffffffffac8);
    pcVar6 = QByteArray::constData((QByteArray *)0x107603);
    QString::toUtf8((QString *)in_stack_fffffffffffffac8);
    pcVar7 = QByteArray::constData((QByteArray *)0x10762a);
    QString::toUtf8((QString *)in_stack_fffffffffffffac8);
    this = (QString *)QByteArray::constData((QByteArray *)0x10765c);
    QString::toUtf8((QString *)in_stack_fffffffffffffac8);
    pcVar8 = QByteArray::constData((QByteArray *)0x107683);
    QString::asprintf(local_328,
                      "%s\n#include \"qvulkanfunctions_p.h\"\n#include \"qvulkaninstance.h\"\n\n#include <QtCore/private/qoffsetstringarray_p.h>\n\nQT_BEGIN_NAMESPACE\n\n%sQVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n{\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\n%sQVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n{\n    QVulkanFunctions *f = inst->functions();\n    Q_ASSERT(f);\n\n    static constexpr auto funcNames = qOffsetStringArray(\n%s\n    );\n    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n    for (int i = 0; i < funcNames.count(); ++i) {\n        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n        if (i < %d && !m_funcs[i])\n            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n    }\n}\n\nQT_END_NAMESPACE\n"
                      ,pcVar3,pcVar6,pcVar7,(ulong)local_480,this,pcVar8,local_47c);
    QByteArray::~QByteArray((QByteArray *)0x1076d6);
    QByteArray::~QByteArray((QByteArray *)0x1076e3);
    QByteArray::~QByteArray((QByteArray *)0x1076f0);
    QByteArray::~QByteArray((QByteArray *)0x1076fd);
    QByteArray::~QByteArray((QByteArray *)0x10770a);
    QString::toUtf8(this);
    QIODevice::write((QByteArray *)&local_18);
    QByteArray::~QByteArray((QByteArray *)0x107741);
    local_449 = true;
    QString::~QString((QString *)0x107761);
    QString::~QString((QString *)0x10776e);
    QString::~QString((QString *)0x10777b);
    QString::~QString((QString *)0x107788);
    QString::~QString((QString *)0x107795);
  }
  QFile::~QFile((QFile *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_449;
  }
  __stack_chk_fail();
}

Assistant:

bool genVulkanFunctionsPC(const QList<VkSpecParser::Command> &commands,
                          const QMap<QString, QStringList> &versionCommandMapping,
                          const QString &licHeaderFn,
                          const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral("_p.cpp"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char s[] =
"%s\n"
"#include \"qvulkanfunctions_p.h\"\n"
"#include \"qvulkaninstance.h\"\n"
"\n"
"#include <QtCore/private/qoffsetstringarray_p.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n%s"
"QVulkanFunctionsPrivate::QVulkanFunctionsPrivate(QVulkanInstance *inst)\n"
"{\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = inst->getInstanceProcAddr(funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n%s"
"QVulkanDeviceFunctionsPrivate::QVulkanDeviceFunctionsPrivate(QVulkanInstance *inst, VkDevice device)\n"
"{\n"
"    QVulkanFunctions *f = inst->functions();\n"
"    Q_ASSERT(f);\n\n"
"    static constexpr auto funcNames = qOffsetStringArray(\n"
"%s\n"
"    );\n"
"    static_assert(std::extent_v<decltype(m_funcs)> == size_t(funcNames.count()));\n"
"    for (int i = 0; i < funcNames.count(); ++i) {\n"
"        m_funcs[i] = f->vkGetDeviceProcAddr(device, funcNames.at(i));\n"
"        if (i < %d && !m_funcs[i])\n"
"            qWarning(\"QVulkanDeviceFunctions: Failed to resolve %%s\", funcNames.at(i));\n"
"    }\n"
"}\n"
"\n"
"QT_END_NAMESPACE\n";

    QString devCmdWrapperStr;
    QString instCmdWrapperStr;
    int devIdx = 0;
    int instIdx = 0;
    QString devCmdNamesStr;
    QString instCmdNamesStr;
    int vulkan10DevCount = 0;
    int vulkan10InstCount = 0;

    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdWrapperStr += "\n#if " + version + "\n";
        devCmdWrapperStr += "\n#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdWrapperStr : &instCmdWrapperStr;
            int *idx = c.deviceLevel ? &devIdx : &instIdx;
            *dst += funcSig(c, c.deviceLevel ? "QVulkanDeviceFunctions" : "QVulkanFunctions");
            *dst += QString(QStringLiteral("\n{\n    Q_ASSERT(d_ptr->m_funcs[%1]);\n    ")).arg(*idx);
            *dst += funcCall(c, *idx);
            *dst += QStringLiteral(";\n}\n\n");
            *idx += 1;

            dst = c.deviceLevel ? &devCmdNamesStr : &instCmdNamesStr;
            *dst += QStringLiteral("        \"");
            *dst += c.cmd.name;
            *dst += QStringLiteral("\",\n");
        }
        if (version == QStringLiteral("VK_VERSION_1_0")) {
            vulkan10InstCount = instIdx;
            vulkan10DevCount = devIdx;
        }
        instCmdWrapperStr += "#endif\n\n";
        devCmdWrapperStr += "#endif\n\n";
    }

    if (devCmdNamesStr.size() > 2)
        devCmdNamesStr.chop(2);
    if (instCmdNamesStr.size() > 2)
        instCmdNamesStr.chop(2);

    const QString str =
            QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdWrapperStr.toUtf8().constData(),
                              instCmdNamesStr.toUtf8().constData(), vulkan10InstCount,
                              devCmdWrapperStr.toUtf8().constData(),
                              devCmdNamesStr.toUtf8().constData(), vulkan10DevCount);

    f.write(str.toUtf8());

    return true;
}